

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall
wasm_instance_t::wasm_instance_t(wasm_instance_t *this,RefPtr<wabt::interp::Instance> *ptr)

{
  Instance *pIVar1;
  Store *this_00;
  Index index;
  Index IVar2;
  
  pIVar1 = ptr->obj_;
  this_00 = ptr->store_;
  if (this_00 == (Store *)0x0) {
    (this->super_wasm_ref_t).I.obj_ = &pIVar1->super_Object;
    (this->super_wasm_ref_t).I.store_ = (Store *)0x0;
    index = 0;
    IVar2 = 0;
  }
  else {
    index = wabt::interp::Store::CopyRoot(this_00,ptr->root_index_);
    (this->super_wasm_ref_t).I.obj_ = &pIVar1->super_Object;
    (this->super_wasm_ref_t).I.store_ = this_00;
    IVar2 = wabt::interp::Store::CopyRoot(this_00,index);
  }
  (this->super_wasm_ref_t).I.root_index_ = IVar2;
  if (pIVar1 != (Instance *)0x0) {
    wabt::interp::Store::DeleteRoot(this_00,index);
    return;
  }
  return;
}

Assistant:

wasm_instance_t(RefPtr<Instance> ptr) : wasm_ref_t(ptr) {}